

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

object __thiscall
pybind11::detail::accessor_policies::str_attr::get(str_attr *this,handle obj,char *key)

{
  char *key_local;
  handle obj_local;
  
  getattr((pybind11 *)this,obj,key);
  return (object)(handle)this;
}

Assistant:

static object get(handle obj, const char *key) { return getattr(obj, key); }